

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

NFABaseState<char,_int> * __thiscall
Centaurus::NFABaseState<char,_int>::offset
          (NFABaseState<char,_int> *__return_storage_ptr__,NFABaseState<char,_int> *this,int value)

{
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *this_00;
  bool bVar1;
  int iVar2;
  pointer pNVar3;
  pointer pNVar4;
  value_type local_68;
  
  __return_storage_ptr__->_vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_00185b20;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar4 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar4 != pNVar3) {
    this_00 = &local_68.m_label.m_ranges;
    do {
      iVar2 = pNVar4->m_dest;
      bVar1 = pNVar4->m_long;
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_00185b58;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_00185b88;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::vector
                (this_00,&(pNVar4->m_label).m_ranges);
      local_68.m_dest = iVar2 + value;
      local_68.m_tag = 0;
      local_68.m_long = bVar1;
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::push_back(&__return_storage_ptr__->m_transitions,&local_68);
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_00185b58;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_00185b88;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (this_00);
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != pNVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

NFABaseState<TCHAR, TLABEL> offset(int value) const
    {
        NFABaseState<TCHAR, TLABEL> new_state;

        for (const auto& transition : m_transitions)
        {
            new_state.add_transition(transition.offset(value));
        }

        return new_state;
    }